

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

UINT8 __thiscall
PlayerA::SetOutputSettings
          (PlayerA *this,UINT32 smplRate,UINT8 channels,UINT8 smplBits,UINT32 smplBufferLen)

{
  PLR_SMPL_PACK p_Var1;
  PLR_SMPL_PACK smplPackFunc;
  UINT32 smplBufferLen_local;
  UINT8 smplBits_local;
  UINT8 channels_local;
  UINT32 smplRate_local;
  PlayerA *this_local;
  
  if (channels == '\x02') {
    p_Var1 = GetSampleConvFunc(smplBits);
    if (p_Var1 == (PLR_SMPL_PACK)0x0) {
      this_local._7_1_ = 0xf1;
    }
    else {
      this->_outSmplChns = '\x02';
      this->_outSmplBits = smplBits;
      this->_outSmplPack = p_Var1;
      SetSampleRate(this,smplRate);
      this->_outSmplSize1 = this->_outSmplBits / 8;
      this->_outSmplSizeA = this->_outSmplSize1 * (uint)this->_outSmplChns;
      std::vector<_waveform_32bit_stereo,_std::allocator<_waveform_32bit_stereo>_>::resize
                (&this->_smplBuf,(ulong)smplBufferLen);
      this_local._7_1_ = '\0';
    }
  }
  else {
    this_local._7_1_ = 0xf0;
  }
  return this_local._7_1_;
}

Assistant:

UINT8 PlayerA::SetOutputSettings(UINT32 smplRate, UINT8 channels, UINT8 smplBits, UINT32 smplBufferLen)
{
	if (channels != 2)
		return 0xF0;	// TODO: support channels = 1
	PLR_SMPL_PACK smplPackFunc = GetSampleConvFunc(smplBits);
	if (smplPackFunc == NULL)
		return 0xF1;	// unsupported sample format
	
	_outSmplChns = channels;
	_outSmplBits = smplBits;
	_outSmplPack = smplPackFunc;
	SetSampleRate(smplRate);
	_outSmplSize1 = _outSmplBits / 8;
	_outSmplSizeA = _outSmplSize1 * _outSmplChns;
	_smplBuf.resize(smplBufferLen);
	return 0x00;
}